

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool pop_up_ask_location(Am_Object *sel_widget,bool growing,Am_Object *ref_obj,int *ask_left,
                        int *ask_top,int *ask_width,int *ask_height,int old_width,int old_height)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  ostream *poVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Method_Wrapper *value;
  void *this;
  Am_Object local_d8;
  bool local_c9;
  bool as_line;
  Am_Object loc_ref_obj;
  Am_Inter_Location new_loc;
  undefined1 local_b0 [8];
  Am_Value ok;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object feedback;
  char *local_50;
  char *msg;
  Am_Object inter;
  int *ask_width_local;
  int *ask_top_local;
  int *ask_left_local;
  Am_Object *ref_obj_local;
  bool growing_local;
  Am_Object *sel_widget_local;
  
  inter.data = (Am_Object_Data *)ask_width;
  bVar2 = Am_Object::Valid(ref_obj);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"No ref_object for pop_up_ask_location");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  pAVar4 = Am_Object::Get(ref_obj,Am_LOCATION_PLACEHOLDER,3);
  Am_Object::Am_Object((Am_Object *)&msg,pAVar4);
  bVar2 = Am_Object::Valid((Am_Object *)&msg);
  if (!bVar2) {
    Am_Object::Get_Object(&local_70,(Am_Slot_Key)sel_widget,0x1df);
    Am_Object::Copy(&local_68,(char *)&local_70);
    Am_Object::~Am_Object(&local_70);
    Am_Object::Create(&local_88,(char *)&Am_New_Points_Interactor);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
    pAVar6 = Am_Object::Set(&local_88,0xdc,pAVar5,0);
    pAVar6 = Am_Object::Set(pAVar6,0xcd,0x6e,0);
    value = Am_Create_New_Object_Method::operator_cast_to_Am_Method_Wrapper_
                      (&done_location_ask_inter);
    pAVar6 = Am_Object::Set(pAVar6,0xde,value,0);
    Am_Object::Get_Object(&local_80,(Am_Slot_Key)pAVar6,0xc5);
    pAVar6 = Am_Object::Set(&local_80,0x154,-1,0);
    Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)pAVar6);
    Am_Object::operator=((Am_Object *)&msg,&local_78);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_80);
    Am_Object::~Am_Object(&local_88);
    AVar1 = Am_LOCATION_PLACEHOLDER;
    Am_Object::Am_Object(&local_90,(Am_Object *)&msg);
    pAVar6 = Am_Object::Add_Part(ref_obj,AVar1,&local_90,0);
    Am_Object::Am_Object(&local_98,&local_68);
    Am_Object::Add_Part(pAVar6,&local_98,true,0);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_68);
  }
  pAVar6 = Am_Object::Set((Am_Object *)&msg,0xcc,true,0);
  AVar1 = Am_LOCATION_PLACEHOLDER;
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&am_askclickpos);
  Am_Object::Set(pAVar6,AVar1,pAVar5,1);
  if (growing) {
    pAVar6 = Am_Object::Set((Am_Object *)&msg,0xdf,2,0);
    pAVar6 = Am_Object::Set(pAVar6,0xd7,0,0);
    Am_Object::Set(pAVar6,0xd8,0,0);
    local_50 = "Press and drag in the window to define a new position and size";
  }
  else {
    pAVar6 = Am_Object::Set((Am_Object *)&msg,0xdf,1,0);
    pAVar6 = Am_Object::Set(pAVar6,0xd7,old_width,0);
    Am_Object::Set(pAVar6,0xd8,old_height,0);
    local_50 = "Click in the window to define a new position";
  }
  Am_Object::Set(&am_askclickpos,0x169,0,0);
  Am_Object::Get_Object((Am_Object *)&ok.value,0x3088,0x150);
  Am_Object::Set((Am_Object *)&ok.value,0xab,local_50,0);
  Am_Object::~Am_Object((Am_Object *)&ok.value);
  Am_Value::Am_Value((Am_Value *)local_b0);
  Am_Object::Am_Object((Am_Object *)&new_loc,&am_askclickpos);
  Am_Pop_Up_Window_And_Wait((Am_Object *)&new_loc,(Am_Value *)local_b0,false);
  Am_Object::~Am_Object((Am_Object *)&new_loc);
  Am_Object::Set((Am_Object *)&msg,0xcc,false,0);
  bVar2 = Am_Value::Valid((Am_Value *)local_b0);
  if (bVar2) {
    pAVar4 = Am_Object::Get(&am_askclickpos,0x169,0);
    Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&loc_ref_obj,pAVar4);
    if ((am_sdebug & 1U) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"pop up returned the value ");
      poVar3 = operator<<(poVar3,(Am_Inter_Location *)&loc_ref_obj);
      this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    }
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff38);
    Am_Object::Am_Object(&local_d8,ref_obj);
    Am_Inter_Location::Translate_To((Am_Inter_Location *)&loc_ref_obj,&local_d8);
    Am_Object::~Am_Object(&local_d8);
    Am_Inter_Location::Get_Location
              ((Am_Inter_Location *)&loc_ref_obj,&local_c9,(Am_Object *)&stack0xffffffffffffff38,
               ask_left,ask_top,(int *)inter.data,ask_height);
    sel_widget_local._7_1_ = true;
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff38);
    Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&loc_ref_obj);
  }
  else {
    sel_widget_local._7_1_ = false;
  }
  Am_Value::~Am_Value((Am_Value *)local_b0);
  Am_Object::~Am_Object((Am_Object *)&msg);
  return sel_widget_local._7_1_;
}

Assistant:

bool
pop_up_ask_location(Am_Object &sel_widget, bool growing, Am_Object &ref_obj,
                    int &ask_left, int &ask_top, int &ask_width,
                    int &ask_height, int old_width, int old_height)
{
  if (!ref_obj.Valid()) {
    Am_ERROR("No ref_object for pop_up_ask_location");
  }
  Am_Object inter =
      ref_obj.Get(Am_LOCATION_PLACEHOLDER, Am_RETURN_ZERO_ON_ERROR);
  const char *msg;
  if (!inter.Valid()) {
    Am_Object feedback = sel_widget.Get_Object(Am_RECT_FEEDBACK_OBJECT).Copy();
    inter = Am_New_Points_Interactor.Create()
                .Set(Am_FEEDBACK_OBJECT, feedback)
                .Set(Am_PRIORITY, 110)
                .Set(Am_CREATE_NEW_OBJECT_METHOD, done_location_ask_inter)
                .Get_Object(Am_COMMAND)
                .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                .Get_Owner();
    ref_obj.Add_Part(Am_LOCATION_PLACEHOLDER, inter).Add_Part(feedback);
  }
  inter.Set(Am_ACTIVE, true)
      .Set(Am_LOCATION_PLACEHOLDER, am_askclickpos, Am_OK_IF_NOT_THERE);
  if (growing) {
    inter.Set(Am_HOW_MANY_POINTS, 2)
        .Set(Am_MINIMUM_WIDTH, 0)
        .Set(Am_MINIMUM_HEIGHT, 0);
    msg = "Press and drag in the window to define a new position and size";
  } else {
    inter.Set(Am_HOW_MANY_POINTS, 1)
        .Set(Am_MINIMUM_WIDTH, old_width)
        .Set(Am_MINIMUM_HEIGHT, old_height);
    msg = "Click in the window to define a new position";
  }
  am_askclickpos.Set(Am_VALUE, (0L));
  am_askclickpos.Get_Object(Am_LABEL).Set(Am_TEXT, msg);
  Am_Value ok;

  Am_Pop_Up_Window_And_Wait(am_askclickpos, ok, false);
  inter.Set(Am_ACTIVE, false);
  if (ok.Valid()) {
    Am_Inter_Location new_loc = am_askclickpos.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "pop up returned the value " << new_loc << std::endl
                << std::flush;
    Am_Object loc_ref_obj;
    bool as_line;
    new_loc.Translate_To(ref_obj);
    new_loc.Get_Location(as_line, loc_ref_obj, ask_left, ask_top, ask_width,
                         ask_height);
    return true;
  } else
    return false;
}